

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::WFElemStack::reset
          (WFElemStack *this,uint emptyId,uint unknownId,uint xmlId,uint xmlNSId)

{
  XMLStringPool *this_00;
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  undefined2 *puVar4;
  uint uVar5;
  ulong uVar6;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar7;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar8;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  
  this->fStackTop = 0;
  if (this->fXMLPoolId == 0) {
    pRVar8 = (this->fPrefixPool).fHashTable;
    uVar10 = pRVar8->fHashModulus;
    this_00 = &this->fPrefixPool;
    for (pRVar7 = *pRVar8->fBucketList;
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if ((puVar4 == &XMLUni::fgZeroLenString) || (puVar4 == (undefined2 *)0x0)) {
LAB_0029cd5a:
        if (pRVar7->fData != (PoolElem *)0x0) {
          uVar5 = pRVar7->fData->fId;
          goto LAB_0029cd7d;
        }
        break;
      }
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)&XMLUni::fgZeroLenString + lVar9);
        if (*psVar1 == 0) {
          if (*(short *)((long)puVar4 + lVar9) == 0) goto LAB_0029cd5a;
          break;
        }
        psVar2 = (short *)((long)puVar4 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
    }
    uVar5 = XMLStringPool::addNewEntry(this_00,L"");
    pRVar8 = (this->fPrefixPool).fHashTable;
    uVar10 = pRVar8->fHashModulus;
LAB_0029cd7d:
    this->fGlobalPoolId = uVar5;
    uVar6 = 0x78;
    uVar3 = 0x6d;
    puVar11 = &DAT_0035b80e;
    do {
      uVar6 = (ulong)uVar3 + (uVar6 >> 0x18) + uVar6 * 0x26;
      uVar3 = *puVar11;
      puVar11 = puVar11 + 1;
    } while (uVar3 != 0);
    for (pRVar7 = pRVar8->fBucketList[uVar6 % uVar10];
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if (puVar4 == &XMLUni::fgXMLString) {
LAB_0029ce1c:
        if (pRVar7->fData != (PoolElem *)0x0) {
          uVar5 = pRVar7->fData->fId;
          goto LAB_0029ce3f;
        }
        break;
      }
      if (puVar4 != (undefined2 *)0x0) {
        lVar9 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLString + lVar9);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar4 + lVar9) == 0) goto LAB_0029ce1c;
            break;
          }
          psVar2 = (short *)((long)puVar4 + lVar9);
          lVar9 = lVar9 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    uVar5 = XMLStringPool::addNewEntry(this_00,L"xml");
    pRVar8 = (this->fPrefixPool).fHashTable;
    uVar10 = pRVar8->fHashModulus;
LAB_0029ce3f:
    this->fXMLPoolId = uVar5;
    uVar6 = 0x78;
    uVar3 = 0x6d;
    puVar11 = &DAT_0035b8e2;
    do {
      uVar6 = (ulong)uVar3 + (uVar6 >> 0x18) + uVar6 * 0x26;
      uVar3 = *puVar11;
      puVar11 = puVar11 + 1;
    } while (uVar3 != 0);
    for (pRVar7 = pRVar8->fBucketList[uVar6 % uVar10];
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if (puVar4 == &XMLUni::fgXMLNSString) {
LAB_0029ced9:
        if (pRVar7->fData != (PoolElem *)0x0) {
          uVar5 = pRVar7->fData->fId;
          goto LAB_0029cef4;
        }
        break;
      }
      if (puVar4 != (undefined2 *)0x0) {
        lVar9 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLNSString + lVar9);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar4 + lVar9) == 0) goto LAB_0029ced9;
            break;
          }
          psVar2 = (short *)((long)puVar4 + lVar9);
          lVar9 = lVar9 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    uVar5 = XMLStringPool::addNewEntry(this_00,L"xmlns");
LAB_0029cef4:
    this->fXMLNSPoolId = uVar5;
  }
  this->fEmptyNamespaceId = emptyId;
  this->fUnknownNamespaceId = unknownId;
  this->fXMLNamespaceId = xmlId;
  this->fXMLNSNamespaceId = xmlNSId;
  return;
}

Assistant:

void WFElemStack::reset(  const   unsigned int    emptyId
                          , const unsigned int    unknownId
                          , const unsigned int    xmlId
                          , const unsigned int    xmlNSId)
{
    // Reset the stack top to clear the stack
    fStackTop = 0;

    // if first time, put in the standard prefixes
    if (fXMLPoolId == 0) {

        fGlobalPoolId = fPrefixPool.addOrFind(XMLUni::fgZeroLenString);
        fXMLPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLString);
        fXMLNSPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLNSString);
    }

    // And store the new special URI ids
    fEmptyNamespaceId = emptyId;
    fUnknownNamespaceId = unknownId;
    fXMLNamespaceId = xmlId;
    fXMLNSNamespaceId = xmlNSId;
}